

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Kuhn::Game::step(Game *this,int action)

{
  int iVar1;
  uint uVar2;
  uint8_t (*pauVar3) [10];
  int i;
  long lVar4;
  ulong uVar5;
  array<int,_3UL> *paVar6;
  int *piVar7;
  int i_2;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  char local_a [2];
  int local_8 [2];
  
  uVar11 = (ulong)(uint)action;
  if (this->mCurrentPlayer == 3) {
    this->mChanceProbability = 0.16666666666666666;
    lVar4 = 0;
    do {
      (this->mCards)._M_elems[lVar4] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    uVar5 = 4;
    iVar10 = 3;
    do {
      iVar1 = (this->mCards)._M_elems[uVar5 - 2];
      iVar8 = (int)uVar11;
      uVar11 = (long)iVar8 / (long)iVar10 & 0xffffffff;
      iVar8 = iVar8 % iVar10;
      (this->mCards)._M_elems[uVar5 - 2] = (this->mCards)._M_elems[iVar8];
      (this->mCards)._M_elems[iVar8] = iVar1;
      uVar5 = uVar5 - 1;
      iVar10 = iVar10 + -1;
    } while (2 < uVar5);
    pauVar3 = this->mInfoSets;
    lVar4 = 0;
    do {
      (*pauVar3)[0] = (uint8_t)(this->mCards)._M_elems[lVar4];
      lVar4 = lVar4 + 1;
      pauVar3 = pauVar3 + 1;
    } while (lVar4 == 1);
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
    return;
  }
  this->mTurnNum = this->mTurnNum + 1;
  this->mBetPlayerNum = this->mBetPlayerNum + action;
  lVar4 = -0x14;
  do {
    *(char *)((long)(this->mInfoSets + 2) + lVar4 + this->mTurnNum) = (char)action;
    lVar4 = lVar4 + 10;
  } while (lVar4 != 0);
  if ((action == 1) && (this->mFirstBetTurn == -1)) {
    this->mFirstBetTurn = this->mTurnNum;
  }
  uVar12 = this->mTurnNum;
  uVar2 = (int)uVar12 % 2;
  if (1 < (int)uVar12) {
    iVar10 = this->mFirstBetTurn;
    bVar14 = true;
    if (iVar10 < 1 || uVar12 - iVar10 != 1) {
      if (iVar10 == -1 && uVar12 == 2) {
        bVar14 = this->mInfoSets[0][2] == '\0';
      }
      else {
        bVar14 = false;
      }
    }
    iVar10 = this->mBetPlayerNum;
    if (iVar10 == 2) {
      paVar6 = (array<int,_3UL> *)((this->mCards)._M_elems + 1);
      if ((this->mCards)._M_elems[1] <= (this->mCards)._M_elems[0]) {
        paVar6 = &this->mCards;
      }
      lVar4 = (long)paVar6 - (long)&this->mCards;
      *(undefined8 *)((long)this + lVar4 * 2 + 0x18) = 0x4000000000000000;
      lVar9 = 0;
      do {
        if (lVar4 >> 2 != lVar9) {
          (this->mPayoff)._M_elems[lVar9] = -2.0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
    }
    else {
      if (!bVar14) goto LAB_00111397;
      if (iVar10 == 1) {
        (this->mPayoff)._M_elems[uVar2] = 1.0;
        uVar11 = 0;
        do {
          if (uVar2 != uVar11) {
            (this->mPayoff)._M_elems[uVar11] = -1.0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 == 1);
      }
      else if (iVar10 == 0) {
        paVar6 = (array<int,_3UL> *)((this->mCards)._M_elems + 1);
        if ((this->mCards)._M_elems[1] <= (this->mCards)._M_elems[0]) {
          paVar6 = &this->mCards;
        }
        lVar4 = (long)paVar6 - (long)&this->mCards;
        *(undefined8 *)((long)this + lVar4 * 2 + 0x18) = 0x3ff0000000000000;
        lVar9 = 0;
        do {
          if (lVar4 >> 2 != lVar9) {
            (this->mPayoff)._M_elems[lVar9] = -1.0;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
      }
      else {
        if (iVar10 < 2) goto LAB_00111397;
        local_8[0] = -1;
        local_8[1] = -1;
        local_a[0] = '\0';
        local_a[1] = '\0';
        uVar11 = 1;
        if (1 < (int)uVar12) {
          uVar11 = (ulong)uVar12;
        }
        uVar5 = 0;
        do {
          if (this->mInfoSets[0][uVar5 + 1] == '\x01') {
            uVar12 = (uint)uVar5 & 1;
            uVar13 = (ulong)(uVar12 * 4);
            *(undefined4 *)((long)local_8 + uVar13) =
                 *(undefined4 *)((long)(this->mCards)._M_elems + uVar13);
            local_a[uVar12] = '\x01';
          }
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        piVar7 = local_8 + 1;
        if (local_8[1] <= local_8[0]) {
          piVar7 = local_8;
        }
        lVar4 = (long)piVar7 - (long)local_8;
        *(double *)((long)this + lVar4 * 2 + 0x18) = (double)iVar10;
        lVar9 = 0;
        do {
          uVar12 = 0xbff00000;
          if ((local_a[lVar9] != '\x01') || (uVar12 = 0xc0000000, lVar4 >> 2 != lVar9)) {
            (this->mPayoff)._M_elems[lVar9] = (double)((ulong)uVar12 << 0x20);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
      }
    }
    this->mDone = true;
  }
LAB_00111397:
  this->mCurrentPlayer = uVar2;
  return;
}

Assistant:

void Game::step(const int action) {
    // chance node action
    if (mCurrentPlayer == PlayerNum + 1) {
        constexpr int ChanceAN = ChanceActionNum();
        mChanceProbability = 1.0 / double(ChanceAN);
        for (int i = 0; i < CardNum; ++i) {
            mCards[i] = i;
        }
        // shuffle cards
        int a = action;
        for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
            const int c2 = a % (c1 + 1);
            const int tmp = mCards[c1];
            mCards[c1] = mCards[c2];
            mCards[c2] = tmp;
            a = (int) a / (c1 + 1);
        }
        for (int i = 0; i < PlayerNum; ++i) {
            mInfoSets[i][0] = mCards[i];
        }
        mTurnNum = 0;
        mCurrentPlayer = 0;
        mFirstBetTurn = -1;
        mBetPlayerNum = 0;
        mDone = false;
        return;
    }

    // update history
    mTurnNum += 1;
    mBetPlayerNum += action;
    for (auto &infoSet : mInfoSets) {
        infoSet[mTurnNum] = action;
    }
    if (mFirstBetTurn == -1 && action == 1) {
        mFirstBetTurn = mTurnNum;
    }

    // update payoff
    const int plays = mTurnNum;
    const int player = plays % PlayerNum;
    int opponents[PlayerNum - 1];
    for (int i = 0; i < PlayerNum - 1; ++i) {
        opponents[i] = (player + i + 1) % PlayerNum;
    }
    if (plays > 1) {
        const bool terminalPass = (mFirstBetTurn > 0 && (mTurnNum - mFirstBetTurn == PlayerNum - 1)) || (mTurnNum == PlayerNum && mFirstBetTurn == -1 && mInfoSets[0][mTurnNum] == 0);
        // all bet
        if (mBetPlayerNum == PlayerNum) {
            const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
            mPayoff[winPlayer] = 2 * (PlayerNum - 1);
            for (int i = 0; i < PlayerNum; ++i) {
                if (i == winPlayer) {
                    continue;
                }
                mPayoff[i] = -2;
            }
            mDone = true;
        } else if (terminalPass) {
            // all fold
            if (mBetPlayerNum == 0) {
                const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
                mPayoff[winPlayer] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // only one player bet
            else if (mBetPlayerNum == 1) {
                mPayoff[player] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == player) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // more than two players bet
            else if (mBetPlayerNum >= 2) {
                std::array<int, PlayerNum> card{};
                card.fill(-1);
                std::array<bool, PlayerNum> isBet{};
                isBet.fill(false);
                for (int i = 0; i < mTurnNum; ++i) {
                    if (mInfoSets[0][i + 1] == 1) {
                        card[i % PlayerNum] = mCards[i % PlayerNum];
                        isBet[i % PlayerNum] = true;
                    }
                }
                const size_t winPlayer = std::distance(card.begin(), std::max_element(card.begin(), card.end()));
                mPayoff[winPlayer] = 2 * (mBetPlayerNum - 1) + (PlayerNum - mBetPlayerNum);
                for (int i = 0; i < PlayerNum; ++i) {
                    if (!isBet[i]) {
                        mPayoff[i] = -1;
                        continue;
                    }
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -2;
                }
                mDone = true;
            }
        }
    }
    mCurrentPlayer = player;
}